

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O1

void __thiscall jessilib::io::formatted_message::~formatted_message(formatted_message *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::~vector(&this->m_message);
  pcVar1 = (this->m_format)._M_dataplus._M_p;
  paVar2 = &(this->m_format).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}